

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int libyuv::ARGBSobelize
              (uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height,_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelRow)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  void *__ptr;
  uint8_t *puVar5;
  ulong uVar6;
  code *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int iVar12;
  code *pcVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  uint8_t *local_88;
  uint8_t *local_80;
  
  iVar12 = -1;
  if ((height != 0 && 0 < width) && (dst_argb != (uint8_t *)0x0 && src_argb != (uint8_t *)0x0)) {
    if (height < 0) {
      src_argb = src_argb + ~height * src_stride_argb;
      src_stride_argb = -src_stride_argb;
      height = -height;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar13 = ARGBToYJRow_SSSE3;
    }
    else {
      pcVar13 = ARGBToYJRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar13 = ARGBToYJRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0x1fU) == 0) {
      pcVar7 = ARGBToYJRow_AVX2;
    }
    else {
      pcVar7 = ARGBToYJRow_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar7 = pcVar13;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar13 = SobelYRow_C;
    }
    else {
      pcVar13 = SobelYRow_SSE2;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar4 = SobelXRow_C;
    }
    else {
      pcVar4 = SobelXRow_SSE2;
    }
    uVar2 = width + 0x2fU & 0x7fffffe0;
    uVar14 = (ulong)uVar2;
    uVar9 = (ulong)(uVar2 * 2);
    __ptr = malloc((ulong)(uVar2 * 5 + 0x5f));
    puVar5 = (uint8_t *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    local_80 = puVar5 + uVar9 + 0x10;
    puVar10 = puVar5 + uVar14 + 0x10 + uVar9;
    (*pcVar7)(src_argb,local_80,width);
    puVar5[uVar9 + 0xf] = *local_80;
    uVar8 = (ulong)(uint)width;
    uVar6 = (ulong)(width - 1);
    auVar16 = ZEXT216(CONCAT11(puVar5[uVar6 + 0x10 + uVar9],puVar5[uVar6 + 0x10 + uVar9]));
    auVar16 = pshuflw(auVar16,auVar16,0);
    uVar15 = auVar16._0_4_;
    puVar1 = puVar5 + uVar8 + 0x10 + uVar9;
    *(undefined4 *)puVar1 = uVar15;
    *(undefined4 *)(puVar1 + 4) = uVar15;
    *(undefined4 *)(puVar1 + 8) = uVar15;
    *(undefined4 *)(puVar1 + 0xc) = uVar15;
    (*pcVar7)(src_argb,puVar10,width);
    puVar5[uVar14 + 0xf + uVar9] = puVar5[uVar14 + 0x10 + uVar9];
    auVar16 = ZEXT216(CONCAT11(puVar10[uVar6],puVar10[uVar6]));
    auVar16 = pshuflw(auVar16,auVar16,0);
    uVar15 = auVar16._0_4_;
    puVar1 = puVar10 + uVar8;
    *(undefined4 *)puVar1 = uVar15;
    *(undefined4 *)(puVar1 + 4) = uVar15;
    *(undefined4 *)(puVar1 + 8) = uVar15;
    *(undefined4 *)(puVar1 + 0xc) = uVar15;
    *(undefined1 (*) [16])(puVar10 + uVar14 + uVar8) = (undefined1  [16])0x0;
    if (0 < height) {
      iVar12 = 0;
      puVar1 = puVar10 + uVar14;
      local_88 = src_argb;
      do {
        puVar11 = puVar10;
        puVar10 = puVar1;
        iVar3 = 0;
        if (iVar12 < height + -1) {
          iVar3 = src_stride_argb;
        }
        local_88 = local_88 + iVar3;
        (*pcVar7)(local_88,puVar10,width);
        puVar10[-1] = *puVar10;
        puVar10[uVar8] = puVar10[uVar6];
        (*pcVar4)(local_80 + -1,puVar11 + -1,puVar10 + -1,puVar5,width);
        (*pcVar13)(local_80 + -1,puVar10 + -1,puVar5 + uVar14,width);
        (*SobelRow)(puVar5,puVar5 + uVar14,dst_argb,width);
        dst_argb = dst_argb + dst_stride_argb;
        iVar12 = iVar12 + 1;
        puVar1 = local_80;
        local_80 = puVar11;
      } while (height != iVar12);
    }
    free(__ptr);
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int ARGBSobelize(const uint8_t* src_argb,
                        int src_stride_argb,
                        uint8_t* dst_argb,
                        int dst_stride_argb,
                        int width,
                        int height,
                        void (*SobelRow)(const uint8_t* src_sobelx,
                                         const uint8_t* src_sobely,
                                         uint8_t* dst,
                                         int width)) {
  int y;
  void (*ARGBToYJRow)(const uint8_t* src_argb, uint8_t* dst_g, int width) =
      ARGBToYJRow_C;
  void (*SobelYRow)(const uint8_t* src_y0, const uint8_t* src_y1,
                    uint8_t* dst_sobely, int width) = SobelYRow_C;
  void (*SobelXRow)(const uint8_t* src_y0, const uint8_t* src_y1,
                    const uint8_t* src_y2, uint8_t* dst_sobely, int width) =
      SobelXRow_C;
  const int kEdge = 16;  // Extra pixels at start of row for extrude/align.
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }

#if defined(HAS_ARGBTOYJROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBToYJRow = ARGBToYJRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      ARGBToYJRow = ARGBToYJRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBToYJRow = ARGBToYJRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      ARGBToYJRow = ARGBToYJRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBToYJRow = ARGBToYJRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBToYJRow = ARGBToYJRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBToYJRow = ARGBToYJRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      ARGBToYJRow = ARGBToYJRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBToYJRow = ARGBToYJRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      ARGBToYJRow = ARGBToYJRow_MSA;
    }
  }
#endif

#if defined(HAS_SOBELYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelYRow = SobelYRow_SSE2;
  }
#endif
#if defined(HAS_SOBELYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelYRow = SobelYRow_NEON;
  }
#endif
#if defined(HAS_SOBELYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelYRow = SobelYRow_MMI;
  }
#endif
#if defined(HAS_SOBELYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelYRow = SobelYRow_MSA;
  }
#endif
#if defined(HAS_SOBELXROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelXRow = SobelXRow_SSE2;
  }
#endif
#if defined(HAS_SOBELXROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelXRow = SobelXRow_NEON;
  }
#endif
#if defined(HAS_SOBELXROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelXRow = SobelXRow_MMI;
  }
#endif
#if defined(HAS_SOBELXROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelXRow = SobelXRow_MSA;
  }
#endif
  {
    // 3 rows with edges before/after.
    const int kRowSize = (width + kEdge + 31) & ~31;
    align_buffer_64(rows, kRowSize * 2 + (kEdge + kRowSize * 3 + kEdge));
    uint8_t* row_sobelx = rows;
    uint8_t* row_sobely = rows + kRowSize;
    uint8_t* row_y = rows + kRowSize * 2;

    // Convert first row.
    uint8_t* row_y0 = row_y + kEdge;
    uint8_t* row_y1 = row_y0 + kRowSize;
    uint8_t* row_y2 = row_y1 + kRowSize;
    ARGBToYJRow(src_argb, row_y0, width);
    row_y0[-1] = row_y0[0];
    memset(row_y0 + width, row_y0[width - 1], 16);  // Extrude 16 for valgrind.
    ARGBToYJRow(src_argb, row_y1, width);
    row_y1[-1] = row_y1[0];
    memset(row_y1 + width, row_y1[width - 1], 16);
    memset(row_y2 + width, 0, 16);

    for (y = 0; y < height; ++y) {
      // Convert next row of ARGB to G.
      if (y < (height - 1)) {
        src_argb += src_stride_argb;
      }
      ARGBToYJRow(src_argb, row_y2, width);
      row_y2[-1] = row_y2[0];
      row_y2[width] = row_y2[width - 1];

      SobelXRow(row_y0 - 1, row_y1 - 1, row_y2 - 1, row_sobelx, width);
      SobelYRow(row_y0 - 1, row_y2 - 1, row_sobely, width);
      SobelRow(row_sobelx, row_sobely, dst_argb, width);

      // Cycle thru circular queue of 3 row_y buffers.
      {
        uint8_t* row_yt = row_y0;
        row_y0 = row_y1;
        row_y1 = row_y2;
        row_y2 = row_yt;
      }

      dst_argb += dst_stride_argb;
    }
    free_aligned_buffer_64(rows);
  }
  return 0;
}